

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

void __thiscall
llvm::Expected<llvm::DWARFDebugNames::Abbrev>::Expected<llvm::DWARFDebugNames::Abbrev>
          (Expected<llvm::DWARFDebugNames::Abbrev> *this,Abbrev *Val,type *param_2)

{
  storage_type *this_00;
  type *param_2_local;
  Abbrev *Val_local;
  Expected<llvm::DWARFDebugNames::Abbrev> *this_local;
  
  this->field_0x20 = this->field_0x20 & 0xfe;
  this_00 = getStorage(this);
  DWARFDebugNames::Abbrev::Abbrev(this_00,Val);
  return;
}

Assistant:

Expected(OtherT &&Val,
           typename std::enable_if<std::is_convertible<OtherT, T>::value>::type
               * = nullptr)
      : HasError(false)
#if LLVM_ENABLE_ABI_BREAKING_CHECKS
        // Expected is unchecked upon construction in Debug builds.
        , Unchecked(true)
#endif
  {
    new (getStorage()) storage_type(std::forward<OtherT>(Val));
  }